

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.h
# Opt level: O2

string * format(string *__return_storage_ptr__,string *fmt_str,...)

{
  string *psVar1;
  char in_AL;
  int iVar2;
  int iVar3;
  pointer __p;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int iVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  unique_ptr<char[],_std::default_delete<char[]>_> formatted;
  va_list ap;
  string str;
  allocator<char> local_139;
  _Head_base<0UL,_char_*,_false> local_138;
  string *local_130;
  undefined8 local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  undefined1 *local_108;
  undefined8 local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  iVar4 = (int)fmt_str->_M_string_length * 2;
  local_108 = local_f8;
  local_100 = 0;
  local_138._M_head_impl = (char *)0x0;
  local_f8[0] = 0;
  local_130 = __return_storage_ptr__;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  while( true ) {
    __p = (pointer)operator_new__((long)iVar4);
    std::__uniq_ptr_impl<char,_std::default_delete<char[]>_>::reset
              ((__uniq_ptr_impl<char,_std::default_delete<char[]>_> *)&local_138,__p);
    strcpy(local_138._M_head_impl,(fmt_str->_M_dataplus)._M_p);
    local_128 = 0x3000000010;
    local_118 = local_e8;
    local_120 = &stack0x00000008;
    iVar2 = vsnprintf(local_138._M_head_impl,(long)iVar4,(fmt_str->_M_dataplus)._M_p,&local_128);
    psVar1 = local_130;
    if (-1 < iVar2 && iVar2 < iVar4) break;
    iVar3 = (iVar2 - iVar4) + 1;
    iVar2 = -iVar3;
    if (0 < iVar3) {
      iVar2 = iVar3;
    }
    iVar4 = iVar4 + iVar2;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,local_138._M_head_impl,&local_139);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_138);
  std::__cxx11::string::~string((string *)&local_108);
  return psVar1;
}

Assistant:

std::string format(const std::string fmt_str, ...) {
    int final_n, n = ((int)fmt_str.size()) * 2; /* reserve 2 times as much as the length of the fmt_str */
    std::string str;
    std::unique_ptr<char[]> formatted;
    va_list ap;
    while(1) {
        formatted.reset(new char[n]); /* wrap the plain char array into the unique_ptr */
        strcpy(&formatted[0], fmt_str.c_str());
        va_start(ap, fmt_str);
        final_n = vsnprintf(&formatted[0], n, fmt_str.c_str(), ap);
        va_end(ap);
        if (final_n < 0 || final_n >= n)
            n += abs(final_n - n + 1);
        else
            break;
    }
    return std::string(formatted.get());
}